

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

ostream * wasm::DataFlow::dump(Graph *graph,ostream *o)

{
  pointer puVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  LocalSet *pLVar3;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  pointer puVar4;
  undefined8 uStack_38;
  
  puVar1 = (graph->nodes).
           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uStack_38 = in_RAX;
  for (puVar4 = (graph->nodes).
                super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"NODE ",5);
    poVar2 = std::ostream::_M_insert<void_const*>(o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    dump((puVar4->_M_t).
         super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>.
         super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl,o,0);
    pLVar3 = Graph::getSet(graph,(puVar4->_M_t).
                                 super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                 .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl)
    ;
    if (pLVar3 != (LocalSet *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"  and that is set to local ",0x1b);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
    }
  }
  return o;
}

Assistant:

inline std::ostream& dump(Graph& graph, std::ostream& o) {
  for (auto& node : graph.nodes) {
    o << "NODE " << node.get() << ": ";
    dump(node.get(), o);
    if (auto* set = graph.getSet(node.get())) {
      o << "  and that is set to local " << set->index << '\n';
    }
  }
  return o;
}